

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::Expression::bindLookupResult
          (Expression *this,Compilation *compilation,LookupResult *result,SourceRange sourceRange,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Scope *pSVar6;
  ulong uVar7;
  CompilationOptions *pCVar8;
  bool bVar9;
  SymbolKind SVar10;
  Type *pTVar11;
  Expression *pEVar12;
  SubroutineSymbol *pSVar13;
  MemberSelector *selector;
  variant_alternative_t<0UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_> *ppEVar14;
  InvocationExpressionSyntax *symbol;
  InvocationExpressionSyntax *instanceCtx;
  SourceLocation SVar15;
  VariableSymbol *this_00;
  ulong index;
  SourceRange range;
  SourceRange sourceRange_00;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  selectors_00;
  SourceRange range_00;
  SourceRange sourceRange_01;
  SourceRange SVar16;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  undefined1 in_stack_fffffffffffffd68;
  SourceLocation in_stack_fffffffffffffd70;
  InvocationExpressionSyntax *invocation_local;
  SourceRange sourceRange_local;
  ArrayOrRandomizeMethodExpressionSyntax *withClause_local;
  Compilation *local_260;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  selectors;
  SourceLocation SStack_240;
  anon_class_32_4_8f84bd9b errorIfInvoke;
  LookupResult nextResult;
  
  invocation_local = (InvocationExpressionSyntax *)sourceRange.endLoc;
  sourceRange_local.endLoc = sourceRange.startLoc;
  this_00 = (VariableSymbol *)(compilation->super_BumpAllocator).head;
  sourceRange_local.startLoc = (SourceLocation)result;
  withClause_local = (ArrayOrRandomizeMethodExpressionSyntax *)invocation;
  if (this_00 == (VariableSymbol *)0x0) {
    pEVar12 = badExpr((Compilation *)this,(Expression *)0x0);
    return pEVar12;
  }
  errorIfInvoke.invocation = &invocation_local;
  errorIfInvoke.sourceRange = &sourceRange_local;
  errorIfInvoke.context = (ASTContext *)withClause;
  errorIfInvoke.withClause = &withClause_local;
  SStack_240 = in_stack_fffffffffffffd70;
  if ((((ulong)(withClause->method).ptr & 4) != 0) &&
     (bVar9 = Symbol::isType((Symbol *)this_00), SStack_240 = in_stack_fffffffffffffd70, bVar9)) {
    sourceRange_01.endLoc = (SourceLocation)withClause;
    sourceRange_01.startLoc = sourceRange_local.endLoc;
    pTVar11 = Type::fromLookupResult
                        ((Type *)this,compilation,(LookupResult *)sourceRange_local.startLoc,
                         sourceRange_01,(ASTContext *)invocation);
    pEVar12 = &BumpAllocator::
               emplace<slang::ast::DataTypeExpression,slang::ast::Type_const&,slang::SourceRange&>
                         ((BumpAllocator *)this,pTVar11,&sourceRange_local)->super_Expression;
    bVar9 = bad(pEVar12);
    if (bVar9) {
      return pEVar12;
    }
    bVar9 = bindLookupResult::anon_class_32_4_8f84bd9b::operator()(&errorIfInvoke);
    if (bVar9) {
      return pEVar12;
    }
    goto LAB_00213f56;
  }
  instanceCtx = invocation_local;
  if (invocation_local == (InvocationExpressionSyntax *)0x0) {
LAB_00213c64:
    SVar10 = (this_00->super_ValueSymbol).super_Symbol.kind;
  }
  else {
    SVar10 = (this_00->super_ValueSymbol).super_Symbol.kind;
    if (SVar10 == Variable) {
      lVar2._0_4_ = (compilation->options).maxConstexprBacktrace;
      lVar2._4_4_ = (compilation->options).maxDefParamSteps;
      if ((((lVar2 == 0) &&
           (pSVar6 = (this_00->super_ValueSymbol).super_Symbol.parentScope, pSVar6 != (Scope *)0x0))
          && (pSVar6->thisSym->kind == Subroutine)) &&
         (pSVar13 = Symbol::as<slang::ast::SubroutineSymbol>(pSVar6->thisSym),
         pSVar13->returnValVar == this_00)) {
        pSVar13 = Symbol::as<slang::ast::SubroutineSymbol>(pSVar6->thisSym);
        if (pSVar13->subroutineKind != Function) {
          assert::assertFailed
                    ("scope->asSymbol().as<SubroutineSymbol>().subroutineKind == SubroutineKind::Function"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Expression.cpp"
                     ,0x3ba,
                     "static Expression &slang::ast::Expression::bindLookupResult(Compilation &, LookupResult &, SourceRange, const InvocationExpressionSyntax *, const ArrayOrRandomizeMethodExpressionSyntax *, const ASTContext &)"
                    );
        }
        this_00 = (VariableSymbol *)pSVar6->thisSym;
      }
      goto LAB_00213c64;
    }
  }
  symbol = invocation_local;
  local_260 = (Compilation *)this;
  if ((SVar10 - Sequence < 2) || (SVar10 == LetDecl)) {
    lVar4._0_4_ = (compilation->options).maxConstexprBacktrace;
    lVar4._4_4_ = (compilation->options).maxDefParamSteps;
    if (lVar4 == 0) {
      invocation_local = (InvocationExpressionSyntax *)0x0;
    }
    else {
      symbol = (InvocationExpressionSyntax *)0x0;
    }
    SVar16.endLoc = (SourceLocation)withClause;
    SVar16.startLoc = sourceRange_local.endLoc;
    pEVar12 = AssertionInstanceExpression::fromLookup
                        ((AssertionInstanceExpression *)this_00,(Symbol *)symbol,
                         (InvocationExpressionSyntax *)sourceRange_local.startLoc,SVar16,
                         (ASTContext *)invocation);
    if (((this_00->super_ValueSymbol).super_Symbol.kind == LetDecl) &&
       (*(char *)((long)&(compilation->options).maxInstanceDepth + 1) == '\x01')) {
      if (symbol == (InvocationExpressionSyntax *)0x0) {
        sourceRange_00.endLoc = sourceRange_local.endLoc;
        sourceRange_00.startLoc = sourceRange_local.startLoc;
      }
      else {
        sourceRange_00 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)symbol);
      }
      ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x5b0007,sourceRange_00);
    }
  }
  else if (SVar10 == ConstraintBlock) {
    lVar5._0_4_ = (compilation->options).maxConstexprBacktrace;
    lVar5._4_4_ = (compilation->options).maxDefParamSteps;
    SVar15._1_7_ = 0;
    SVar15._0_1_ = lVar5 != 0;
    bVar1 = *(byte *)((long)&(compilation->options).maxInstanceDepth + 1);
LAB_00213d86:
    sourceRange_03.endLoc = SVar15;
    sourceRange_03.startLoc = sourceRange_local.endLoc;
    pEVar12 = ValueExpressionBase::fromSymbol
                        ((ValueExpressionBase *)withClause,(ASTContext *)this_00,
                         (Symbol *)(ulong)bVar1,sourceRange_local.startLoc._0_1_,sourceRange_03,
                         (bool)in_stack_fffffffffffffd68);
  }
  else if (SVar10 == AssertionPort) {
    range_00.endLoc = (SourceLocation)withClause;
    range_00.startLoc = sourceRange_local.endLoc;
    pEVar12 = AssertionInstanceExpression::bindPort
                        ((AssertionInstanceExpression *)this_00,(Symbol *)sourceRange_local.startLoc
                         ,range_00,(ASTContext *)instanceCtx);
  }
  else {
    if (SVar10 != Subroutine) {
      bVar1 = *(byte *)((long)&(compilation->options).maxInstanceDepth + 1);
      SVar15 = (SourceLocation)0x0;
      goto LAB_00213d86;
    }
    lVar3._0_4_ = (compilation->options).maxConstexprBacktrace;
    lVar3._4_4_ = (compilation->options).maxDefParamSteps;
    if (lVar3 != 0) {
      assert::assertFailed
                ("result.selectors.empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Expression.cpp"
                 ,0x3c2,
                 "static Expression &slang::ast::Expression::bindLookupResult(Compilation &, LookupResult &, SourceRange, const InvocationExpressionSyntax *, const ArrayOrRandomizeMethodExpressionSyntax *, const ASTContext &)"
                );
    }
    if (invocation_local == (InvocationExpressionSyntax *)0x0) {
      range.endLoc = sourceRange_local.endLoc;
      range.startLoc = sourceRange_local.startLoc;
    }
    else {
      range = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)invocation_local);
    }
    nextResult.found = &Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)this_00)->super_Symbol;
    nextResult.selectors.
    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
    .firstElement[0] = '\0';
    SStack_240 = range.endLoc;
    pEVar12 = CallExpression::fromLookup
                        ((CallExpression *)this,(Compilation *)&nextResult,(Subroutine *)0x0,
                         (Expression *)invocation_local,
                         (InvocationExpressionSyntax *)withClause_local,withClause,range,
                         (ASTContext *)compilation);
    invocation_local = (InvocationExpressionSyntax *)0x0;
    withClause_local = (ArrayOrRandomizeMethodExpressionSyntax *)0x0;
  }
  pCVar8 = &compilation->options;
  for (index = 0; uVar7._0_4_ = (compilation->options).maxConstexprBacktrace,
      uVar7._4_4_ = (compilation->options).maxDefParamSteps, bVar9 = bad(pEVar12), index < uVar7;
      index = index + 1) {
    if (bVar9) {
      return pEVar12;
    }
    selector = (MemberSelector *)
               SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
               ::operator[]((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                             *)&pCVar8->maxConstexprDepth,index);
    if ((char)selector[1].name._M_len == '\x01') {
      pTVar11 = not_null<const_slang::ast::Type_*>::get(&pEVar12->type);
      bVar9 = Type::isVirtualInterface(pTVar11);
      if (bVar9) {
        nextResult.selectors.
        super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
        .data_ = (pointer)nextResult.selectors.
                          super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                          .firstElement;
        nextResult.found = (Symbol *)0x0;
        nextResult.systemSubroutine._0_5_ = 0;
        nextResult.systemSubroutine._5_3_ = 0;
        nextResult.wasImported = false;
        nextResult.isHierarchical = false;
        nextResult.suppressUndeclared = false;
        nextResult.fromTypeParam = false;
        nextResult.fromForwardTypedef = false;
        nextResult.selectors.
        super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
        .len = 0;
        nextResult.selectors.
        super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
        .cap = 4;
        nextResult.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.data_ =
             (pointer)nextResult.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                      super_SmallVectorBase<slang::Diagnostic>.firstElement;
        nextResult.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.len = 0;
        nextResult.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.cap = 2;
        selectors.data_ = *(pointer *)&(compilation->options).maxConstexprDepth;
        selectors.size_._0_4_ = (compilation->options).maxConstexprBacktrace;
        selectors.size_._4_4_ = (compilation->options).maxDefParamSteps;
        pTVar11 = not_null<const_slang::ast::Type_*>::get(&pEVar12->type);
        SVar16 = pEVar12->sourceRange;
        selectors_00 = nonstd::span_lite::
                       span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
                       ::subspan(&selectors,index,0xffffffffffffffff);
        Lookup::selectChild(pTVar11,SVar16,selectors_00,(ASTContext *)withClause,&nextResult);
        LookupResult::reportDiags(&nextResult,(ASTContext *)withClause);
        if (nextResult.found == (Symbol *)0x0) {
          pEVar12 = badExpr(local_260,pEVar12);
        }
        else {
          sourceRange_02.endLoc = (SourceLocation)invocation_local;
          sourceRange_02.startLoc = sourceRange_local.endLoc;
          pEVar12 = bindLookupResult((Expression *)local_260,(Compilation *)&nextResult,
                                     (LookupResult *)sourceRange_local.startLoc,sourceRange_02,
                                     (InvocationExpressionSyntax *)withClause_local,withClause,
                                     (ASTContext *)SStack_240);
        }
        LookupResult::~LookupResult(&nextResult);
        return pEVar12;
      }
      if (index == *(long *)&(compilation->options).maxConstexprBacktrace - 1U) {
        pEVar12 = MemberAccessExpression::fromSelector
                            (local_260,pEVar12,selector,invocation_local,withClause_local,
                             (ASTContext *)withClause);
        if (pEVar12->kind == Call) {
          invocation_local = (InvocationExpressionSyntax *)0x0;
          withClause_local = (ArrayOrRandomizeMethodExpressionSyntax *)0x0;
        }
      }
      else {
        pEVar12 = MemberAccessExpression::fromSelector
                            (local_260,pEVar12,selector,(InvocationExpressionSyntax *)0x0,
                             (ArrayOrRandomizeMethodExpressionSyntax *)0x0,(ASTContext *)withClause)
        ;
      }
    }
    else {
      ppEVar14 = std::
                 get<0ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                           ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                             *)selector);
      pEVar12 = bindSelector(local_260,pEVar12,*ppEVar14,(ASTContext *)withClause);
    }
  }
  if (bVar9) {
    return pEVar12;
  }
  bVar9 = bindLookupResult::anon_class_32_4_8f84bd9b::operator()(&errorIfInvoke);
  this = (Expression *)local_260;
  if (bVar9) {
    return pEVar12;
  }
LAB_00213f56:
  pEVar12 = badExpr((Compilation *)this,pEVar12);
  return pEVar12;
}

Assistant:

Expression& Expression::bindLookupResult(Compilation& compilation, LookupResult& result,
                                         SourceRange sourceRange,
                                         const InvocationExpressionSyntax* invocation,
                                         const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                         const ASTContext& context) {
    const Symbol* symbol = result.found;
    if (!symbol)
        return badExpr(compilation, nullptr);

    auto errorIfInvoke = [&]() {
        // If we require a subroutine, enforce that now. The invocation syntax will have been
        // nulled out if we used it elsewhere in this function.
        if (invocation) {
            SourceLocation loc = invocation->arguments ? invocation->arguments->openParen.location()
                                                       : sourceRange.start();
            auto& diag = context.addDiag(diag::ExpressionNotCallable, loc);
            diag << sourceRange;
            return false;
        }
        else if (withClause) {
            context.addDiag(diag::UnexpectedWithClause, withClause->with.range());
            return false;
        }
        return true;
    };

    if (context.flags.has(ASTFlags::AllowDataType) && symbol->isType()) {
        // We looked up a named data type and we were allowed to do so, so return it.
        const Type& resultType = Type::fromLookupResult(compilation, result, sourceRange, context);
        auto expr = compilation.emplace<DataTypeExpression>(resultType, sourceRange);
        if (!expr->bad() && !errorIfInvoke())
            return badExpr(compilation, expr);

        return *expr;
    }

    // Recursive function call
    if (invocation && symbol->kind == SymbolKind::Variable && result.selectors.empty()) {
        // TODO: check nested scopes?
        auto scope = symbol->getParentScope();
        if (scope && scope->asSymbol().kind == SymbolKind::Subroutine &&
            scope->asSymbol().as<SubroutineSymbol>().returnValVar == symbol) {
            ASSERT(scope->asSymbol().as<SubroutineSymbol>().subroutineKind ==
                   SubroutineKind::Function);
            symbol = &scope->asSymbol();
        }
    }

    Expression* expr;
    switch (symbol->kind) {
        case SymbolKind::Subroutine: {
            ASSERT(result.selectors.empty());
            SourceRange callRange = invocation ? invocation->sourceRange() : sourceRange;
            expr = &CallExpression::fromLookup(compilation, &symbol->as<SubroutineSymbol>(),
                                               nullptr, invocation, withClause, callRange, context);
            invocation = nullptr;
            withClause = nullptr;
            break;
        }
        case SymbolKind::Sequence:
        case SymbolKind::Property:
        case SymbolKind::LetDecl: {
            const InvocationExpressionSyntax* localInvoke = nullptr;
            if (result.selectors.empty())
                localInvoke = std::exchange(invocation, nullptr);

            expr = &AssertionInstanceExpression::fromLookup(*symbol, localInvoke, sourceRange,
                                                            context);

            if (symbol->kind == SymbolKind::LetDecl && result.isHierarchical) {
                SourceRange callRange = localInvoke ? localInvoke->sourceRange() : sourceRange;
                context.addDiag(diag::LetHierarchical, callRange);
            }
            break;
        }
        case SymbolKind::AssertionPort:
            expr = &AssertionInstanceExpression::bindPort(*symbol, sourceRange, context);
            break;
        case SymbolKind::ConstraintBlock: {
            // If there are selectors then this is ok -- either they will be valid because
            // they're accessing a built-in method or they will issue an error.
            bool constraintAllowed = !result.selectors.empty();
            expr = &ValueExpressionBase::fromSymbol(context, *symbol, result.isHierarchical,
                                                    sourceRange, constraintAllowed);
            break;
        }
        default:
            expr = &ValueExpressionBase::fromSymbol(context, *symbol, result.isHierarchical,
                                                    sourceRange);
            break;
    }

    // Drill down into member accesses.
    for (size_t i = 0; i < result.selectors.size(); i++) {
        if (expr->bad())
            return *expr;

        auto& selector = result.selectors[i];
        auto memberSelect = std::get_if<LookupResult::MemberSelector>(&selector);
        if (memberSelect) {
            // If this is an access via a virtual interface we need to look at
            // all the selectors together, as this may constitute a hierarchical reference.
            if (expr->type->isVirtualInterface()) {
                LookupResult nextResult;
                span<LookupResult::Selector> selectors = result.selectors;
                Lookup::selectChild(*expr->type, expr->sourceRange, selectors.subspan(i), context,
                                    nextResult);

                nextResult.reportDiags(context);
                if (!nextResult.found)
                    return badExpr(compilation, expr);

                return bindLookupResult(compilation, nextResult, sourceRange, invocation,
                                        withClause, context);
            }

            if (i == result.selectors.size() - 1) {
                expr = &MemberAccessExpression::fromSelector(compilation, *expr, *memberSelect,
                                                             invocation, withClause, context);

                if (expr->kind == ExpressionKind::Call) {
                    invocation = nullptr;
                    withClause = nullptr;
                }
            }
            else {
                expr = &MemberAccessExpression::fromSelector(compilation, *expr, *memberSelect,
                                                             nullptr, nullptr, context);
            }
        }
        else {
            // Element / range selectors.
            auto selectSyntax = std::get<const ElementSelectSyntax*>(selector);
            expr = &bindSelector(compilation, *expr, *selectSyntax, context);
        }
    }

    if (!expr->bad() && !errorIfInvoke())
        return badExpr(compilation, expr);

    return *expr;
}